

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

int wally_sha256_midstate(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  undefined1 local_b8 [7];
  _Bool aligned;
  sha256_ctx ctx;
  sha256 sha;
  size_t len_local;
  uchar *bytes_out_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if ((((bytes == (uchar *)0x0) && (bytes_len != 0)) || (bytes_out == (uchar *)0x0)) ||
     (len != 0x20)) {
    bytes_local._4_4_ = -2;
  }
  else {
    sha256_init((sha256_ctx *)local_b8);
    sha256_update((sha256_ctx *)local_b8,bytes,bytes_len);
    sha256_midstate((sha256_ctx *)local_b8,(sha256 *)bytes_out);
    wally_clear(local_b8,0x68);
    bytes_local._4_4_ = 0;
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_sha256_midstate(const unsigned char *bytes, size_t bytes_len,
                          unsigned char *bytes_out, size_t len)
{
    struct sha256 sha;
    struct sha256_ctx ctx;
    bool aligned = alignment_ok(bytes_out, sizeof(sha.u.u32));

    if ((!bytes && bytes_len != 0) || !bytes_out || len != SHA256_LEN)
        return WALLY_EINVAL;

    sha256_init(&ctx);
    sha256_update(&ctx, bytes, bytes_len);
    sha256_midstate(&ctx, aligned ? (struct sha256 *)bytes_out : &sha);
    wally_clear(&ctx, sizeof(ctx));

    if (!aligned) {
        memcpy(bytes_out, &sha, sizeof(sha));
        wally_clear(&sha, sizeof(sha));
    }
    return WALLY_OK;
}